

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

int fe_process_frames_int16
              (fe_t *fe,int16 **inout_spch,size_t *inout_nsamps,mfcc_t **buf_cep,
              int32 *inout_nframes)

{
  short sVar1;
  size_t sVar2;
  int16 *in;
  int iVar3;
  int iVar4;
  long lVar5;
  int16 *piVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int32 iVar11;
  int iVar12;
  ulong uVar13;
  
  sVar2 = *inout_nsamps;
  iVar12 = fe->num_overflow_samps;
  lVar10 = (long)iVar12;
  uVar13 = sVar2 + lVar10;
  sVar1 = fe->frame_size;
  uVar8 = (ulong)sVar1;
  if (buf_cep == (mfcc_t **)0x0) {
    if (uVar8 <= uVar13) {
      iVar11 = (int)((uVar13 - uVar8) / (ulong)(long)fe->frame_shift) + 1;
      iVar12 = iVar11;
      goto LAB_00125e04;
    }
  }
  else if (uVar13 < uVar8) {
    if (sVar2 != 0) {
      memcpy(fe->overflow_samps + lVar10,*inout_spch,sVar2 * 2);
      sVar2 = *inout_nsamps;
      fe->num_overflow_samps = fe->num_overflow_samps + (int)sVar2;
      *inout_spch = *inout_spch + sVar2;
      *inout_nsamps = 0;
    }
  }
  else {
    iVar4 = *inout_nframes;
    if (0 < iVar4) {
      in = *inout_spch;
      uVar7 = (uint)((uVar13 - uVar8) / (ulong)(long)fe->frame_shift);
      if ((int)(uVar7 + 1) < iVar4) {
        iVar4 = uVar7 + 1;
      }
      if (iVar12 == 0) {
        fe_read_frame_int16(fe,in,(int)sVar1);
        if (0x7ffffffe < uVar7) {
          __assert_fail("outidx < frame_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                        ,0x1ab,
                        "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                       );
        }
        fe_write_frame(fe,*buf_cep);
        sVar1 = fe->frame_size;
        piVar6 = *inout_spch + sVar1;
        *inout_spch = piVar6;
        uVar13 = *inout_nsamps - (long)sVar1;
        *inout_nsamps = uVar13;
      }
      else {
        lVar5 = (long)(sVar1 - iVar12);
        memcpy(fe->overflow_samps + lVar10,in,lVar5 * 2);
        fe_read_frame_int16(fe,fe->overflow_samps,(int)fe->frame_size);
        if (0x7ffffffe < uVar7) {
          __assert_fail("outidx < frame_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                        ,0x1a1,
                        "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                       );
        }
        fe_write_frame(fe,*buf_cep);
        piVar6 = *inout_spch + lVar5;
        *inout_spch = piVar6;
        uVar13 = *inout_nsamps - lVar5;
        *inout_nsamps = uVar13;
        fe->num_overflow_samps = fe->num_overflow_samps - (int)fe->frame_shift;
      }
      if (iVar4 < 2) {
        uVar7 = fe->num_overflow_samps;
        lVar5 = 1;
      }
      else {
        uVar8 = (ulong)(ushort)fe->frame_shift;
        lVar5 = 1;
        do {
          if (uVar13 < (ulong)(long)(short)uVar8) {
            __assert_fail("*inout_nsamps >= (size_t)fe->frame_shift",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                          ,0x1b5,
                          "int fe_process_frames_int16(fe_t *, const int16 **, size_t *, mfcc_t **, int32 *)"
                         );
          }
          fe_shift_frame_int16(fe,piVar6,(int)(short)uVar8);
          fe_write_frame(fe,buf_cep[lVar5]);
          sVar1 = fe->frame_shift;
          uVar8 = (ulong)sVar1;
          piVar6 = *inout_spch + uVar8;
          *inout_spch = piVar6;
          uVar13 = *inout_nsamps - uVar8;
          *inout_nsamps = uVar13;
          uVar7 = fe->num_overflow_samps;
          if (0 < (int)uVar7) {
            uVar7 = uVar7 - (int)sVar1;
            fe->num_overflow_samps = uVar7;
          }
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < iVar4);
      }
      iVar11 = (int32)lVar5;
      if ((int)uVar7 < 1) {
        iVar4 = (int)fe->frame_shift;
        iVar12 = (int)uVar13;
        if (iVar4 <= (int)uVar13) {
          iVar12 = iVar4;
        }
        lVar5 = (long)fe->frame_size - (long)iVar4;
        lVar10 = (long)piVar6 - (long)in >> 1;
        iVar3 = (int)lVar10;
        if (lVar5 <= lVar10) {
          iVar3 = (int)lVar5;
        }
        iVar9 = iVar3 + iVar12;
        fe->num_overflow_samps = iVar9;
        if (iVar9 != 0 && SCARRY4(iVar3,iVar12) == iVar9 < 0) {
          memcpy(fe->overflow_samps,piVar6 + ((long)iVar4 - (long)fe->frame_size),
                 (ulong)(uint)(iVar9 * 2));
          piVar6 = *inout_spch;
          goto LAB_00125df0;
        }
      }
      else {
        memmove(fe->overflow_samps,fe->overflow_samps + (lVar10 - (ulong)uVar7),(ulong)uVar7 * 2);
        iVar4 = (int)((ulong)((long)*inout_spch - (long)in) >> 1) + (int)*inout_nsamps;
        iVar12 = (int)fe->frame_size - fe->num_overflow_samps;
        if (iVar4 <= iVar12) {
          iVar12 = iVar4;
        }
        memcpy(fe->overflow_samps + fe->num_overflow_samps,in,(long)iVar12 * 2);
        fe->num_overflow_samps = fe->num_overflow_samps + iVar12;
        piVar6 = *inout_spch;
        lVar10 = (long)piVar6 - (long)in >> 1;
        if (lVar10 < iVar12) {
          iVar12 = iVar12 - (int)lVar10;
LAB_00125df0:
          *inout_spch = piVar6 + iVar12;
          *inout_nsamps = *inout_nsamps - (long)iVar12;
        }
      }
      iVar12 = 0;
      goto LAB_00125e04;
    }
  }
  iVar11 = 0;
  iVar12 = 0;
LAB_00125e04:
  *inout_nframes = iVar11;
  return iVar12;
}

Assistant:

int
fe_process_frames_int16(fe_t *fe,
                  int16 const **inout_spch,
                  size_t *inout_nsamps,
                  mfcc_t **buf_cep,
                  int32 *inout_nframes)
{
    int32 frame_count;
    int outidx, i, n_overflow, orig_n_overflow;
    int16 const *orig_spch;

    /* In the special case where there is no output buffer, return the
     * maximum number of frames which would be generated. */
    if (buf_cep == NULL) {
        if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size)
            *inout_nframes = 0;
        else
            *inout_nframes = 1
                + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
                   / fe->frame_shift);
        return *inout_nframes;
    }

    /* Are there not enough samples to make at least 1 frame? */
    if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size) {
        if (*inout_nsamps > 0) {
            /* Append them to the overflow buffer. */
            memcpy(fe->overflow_samps + fe->num_overflow_samps,
                   *inout_spch, *inout_nsamps * (sizeof(**inout_spch)));
            fe->num_overflow_samps += *inout_nsamps;
            /* Update input-output pointers and counters. */
            *inout_spch += *inout_nsamps;
            *inout_nsamps = 0;
        }
        /* We produced no frames of output, sorry! */
        *inout_nframes = 0;
        return 0;
    }

    /* Can't write a frame?  Then do nothing! */
    if (*inout_nframes < 1) {
        *inout_nframes = 0;
        return 0;
    }

    /* Keep track of the original start of the buffer. */
    orig_spch = *inout_spch;
    orig_n_overflow = fe->num_overflow_samps;
    /* How many frames will we be able to get? */
    frame_count = 1
        + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
           / fe->frame_shift);
    /* Limit it to the number of output frames available. */
    if (frame_count > *inout_nframes)
        frame_count = *inout_nframes;
    /* Index of output frame. */
    outidx = 0;

    /* Start processing, taking care of any incoming overflow. */
    if (fe->num_overflow_samps) {
        int offset = fe->frame_size - fe->num_overflow_samps;

        /* Append start of spch to overflow samples to make a full frame. */
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               *inout_spch, offset * sizeof(**inout_spch));
        fe_read_frame_int16(fe, fe->overflow_samps, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += offset;
        *inout_nsamps -= offset;
        fe->num_overflow_samps -= fe->frame_shift;
    }
    else {
        fe_read_frame_int16(fe, *inout_spch, fe->frame_size);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_size;
        *inout_nsamps -= fe->frame_size;
    }

    /* Process all remaining frames. */
    for (i = 1; i < frame_count; ++i) {
        assert(*inout_nsamps >= (size_t)fe->frame_shift);

        fe_shift_frame_int16(fe, *inout_spch, fe->frame_shift);
        assert(outidx < frame_count);
        fe_write_frame(fe, buf_cep[outidx]);
        outidx++;
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_shift;
        *inout_nsamps -= fe->frame_shift;
        /* Amount of data behind the original input which is still needed. */
        if (fe->num_overflow_samps > 0)
            fe->num_overflow_samps -= fe->frame_shift;
    }

    /* How many relevant overflow samples are there left? */
    if (fe->num_overflow_samps <= 0) {
        /* Maximum number of overflow samples past *inout_spch to save. */
        n_overflow = *inout_nsamps;
        if (n_overflow > fe->frame_shift)
            n_overflow = fe->frame_shift;
        fe->num_overflow_samps = fe->frame_size - fe->frame_shift;
        /* Make sure this isn't an illegal read! */
        if (fe->num_overflow_samps > *inout_spch - orig_spch)
            fe->num_overflow_samps = *inout_spch - orig_spch;
        fe->num_overflow_samps += n_overflow;
        if (fe->num_overflow_samps > 0) {
            memcpy(fe->overflow_samps,
                   *inout_spch - (fe->frame_size - fe->frame_shift),
                   fe->num_overflow_samps * sizeof(**inout_spch));
            /* Update the input pointer to cover this stuff. */
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }
    else {
        /* There is still some relevant data left in the overflow buffer. */
        /* Shift existing data to the beginning. */
        memmove(fe->overflow_samps,
                fe->overflow_samps + orig_n_overflow - fe->num_overflow_samps,
                fe->num_overflow_samps * sizeof(*fe->overflow_samps));
        /* Copy in whatever we had in the original speech buffer. */
        n_overflow = *inout_spch - orig_spch + *inout_nsamps;
        if (n_overflow > fe->frame_size - fe->num_overflow_samps)
            n_overflow = fe->frame_size - fe->num_overflow_samps;
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               orig_spch, n_overflow * sizeof(*orig_spch));
        fe->num_overflow_samps += n_overflow;
        /* Advance the input pointers. */
        if (n_overflow > *inout_spch - orig_spch) {
            n_overflow -= (*inout_spch - orig_spch);
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }

    /* Finally update the frame counter with the number of frames we processed. */
    *inout_nframes = outidx; /* FIXME: Not sure why I wrote it this way... */
    return 0;
}